

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::
DoSimdNarrow<wabt::interp::Simd<signed_char,(unsigned_char)16>,wabt::interp::Simd<short,(unsigned_char)8>>
          (Thread *this)

{
  undefined1 auVar1 [16];
  Simd<short,_(unsigned_char)__b_> SVar2;
  Simd<short,_(unsigned_char)__b_> SVar3;
  Simd<signed_char,_(unsigned_char)__x10_> value;
  
  SVar2 = Pop<wabt::interp::Simd<short,(unsigned_char)8>>(this);
  SVar3 = Pop<wabt::interp::Simd<short,(unsigned_char)8>>(this);
  auVar1 = packsswb((undefined1  [16])SVar3.v,(undefined1  [16])SVar3.v);
  value.v._0_8_ = auVar1._0_8_;
  auVar1 = packsswb((undefined1  [16])SVar2.v,(undefined1  [16])SVar2.v);
  value.v._8_8_ = auVar1._0_8_;
  Push<wabt::interp::Simd<signed_char,(unsigned_char)16>>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdNarrow() {
  using SL = typename S::LaneType;
  using TL = typename T::LaneType;
  auto rhs = Pop<T>();
  auto lhs = Pop<T>();
  S result;
  for (u8 i = 0; i < T::lanes; ++i) {
    result[i] = Saturate<SL, TL>(lhs[i]);
  }
  for (u8 i = 0; i < T::lanes; ++i) {
    result[T::lanes + i] = Saturate<SL, TL>(rhs[i]);
  }
  Push(result);
  return RunResult::Ok;
}